

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::FillRectDecal(PixelGameEngine *this,vf2d *pos,vf2d *size,Pixel col)

{
  pointer pos_00;
  pointer uv;
  pointer col_00;
  anon_union_4_2_12391da5_for_Pixel_0 local_78;
  anon_union_4_2_12391da5_for_Pixel_0 local_74;
  array<olc::Pixel,_4UL> cols;
  array<olc::v2d_generic<float>,_4UL> uvs;
  array<olc::v2d_generic<float>,_4UL> points;
  vf2d *size_local;
  vf2d *pos_local;
  PixelGameEngine *this_local;
  Pixel col_local;
  
  v2d_generic<float>::v2d_generic(uvs._M_elems + 3,pos);
  v2d_generic<float>::v2d_generic(points._M_elems,pos->x,pos->y + size->y);
  v2d_generic<float>::operator+(points._M_elems + 1,pos);
  v2d_generic<float>::v2d_generic(points._M_elems + 2,pos->x + size->x,pos->y);
  v2d_generic<float>::v2d_generic((v2d_generic<float> *)(cols._M_elems + 2),0.0,0.0);
  v2d_generic<float>::v2d_generic(uvs._M_elems,0.0,0.0);
  v2d_generic<float>::v2d_generic(uvs._M_elems + 1,0.0,0.0);
  v2d_generic<float>::v2d_generic(uvs._M_elems + 2,0.0,0.0);
  local_78 = col.field_0;
  local_74 = col.field_0;
  cols._M_elems[0].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)col;
  cols._M_elems[1].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)col;
  pos_00 = std::array<olc::v2d_generic<float>,_4UL>::data
                     ((array<olc::v2d_generic<float>,_4UL> *)(uvs._M_elems + 3));
  uv = std::array<olc::v2d_generic<float>,_4UL>::data
                 ((array<olc::v2d_generic<float>,_4UL> *)(cols._M_elems + 2));
  col_00 = std::array<olc::Pixel,_4UL>::data((array<olc::Pixel,_4UL> *)&local_78.field_1);
  DrawExplicitDecal(this,(Decal *)0x0,pos_00,uv,col_00,4);
  return;
}

Assistant:

void PixelGameEngine::FillRectDecal(const olc::vf2d& pos, const olc::vf2d& size, const olc::Pixel col)
	{
		std::array<olc::vf2d, 4> points = { { {pos}, {pos.x, pos.y + size.y}, {pos + size}, {pos.x + size.x, pos.y} } };
		std::array<olc::vf2d, 4> uvs = { {{0,0},{0,0},{0,0},{0,0}} };
		std::array<olc::Pixel, 4> cols = { {col, col, col, col} };
		DrawExplicitDecal(nullptr, points.data(), uvs.data(), cols.data(), 4);
	}